

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long __thiscall mkvparser::Segment::DoLoadCluster(Segment *this,longlong *pos,long *len)

{
  long idx_00;
  bool bVar1;
  int iVar2;
  Cues *this_00;
  longlong lVar3;
  Cluster *pCVar4;
  Cues *local_f8;
  long local_f0;
  Cluster *pCluster;
  longlong element_size_1;
  longlong off;
  Cluster *pCluster_1;
  long idx;
  long len_;
  longlong pos_;
  undefined1 local_91;
  Cues *local_90;
  longlong local_88;
  longlong element_size;
  longlong unknown_size;
  longlong size;
  longlong id;
  longlong idpos;
  longlong result;
  longlong cluster_size;
  longlong cluster_off;
  longlong segment_stop;
  long status;
  longlong avail;
  longlong total;
  long *len_local;
  longlong *pos_local;
  Segment *this_local;
  
  total = (longlong)len;
  len_local = pos;
  pos_local = (longlong *)this;
  if (this->m_pos < 0) {
    this_local = (Segment *)DoLoadClusterUnknownSize(this,pos,len);
  }
  else {
    iVar2 = (*this->m_pReader->_vptr_IMkvReader[1])(this->m_pReader,&avail,&status);
    segment_stop = (longlong)iVar2;
    this_local = (Segment *)segment_stop;
    if (-1 < segment_stop) {
      if ((avail < 0) || (status <= avail)) {
        if (this->m_size < 0) {
          local_f0 = -1;
        }
        else {
          local_f0 = this->m_start + this->m_size;
        }
        cluster_off = local_f0;
        cluster_size = -1;
        result = -1;
        while( true ) {
          while( true ) {
            while( true ) {
              if ((-1 < avail) && (avail <= this->m_pos)) {
                return 1;
              }
              if ((-1 < cluster_off) && (cluster_off <= this->m_pos)) {
                return 1;
              }
              *len_local = this->m_pos;
              if (status < *len_local + 1) {
                *(undefined8 *)total = 1;
                return -3;
              }
              idpos = GetUIntLength(this->m_pReader,*len_local,(long *)total);
              if (idpos < 0) {
                return idpos;
              }
              if (0 < idpos) {
                return -3;
              }
              if ((-1 < cluster_off) && (cluster_off < *len_local + *(long *)total)) {
                return -2;
              }
              if (status < *len_local + *(long *)total) {
                return -3;
              }
              id = *len_local;
              size = ReadID(this->m_pReader,id,(long *)total);
              if (size < 0) {
                return -2;
              }
              *len_local = *(long *)total + *len_local;
              if (status < *len_local + 1) {
                *(undefined8 *)total = 1;
                return -3;
              }
              idpos = GetUIntLength(this->m_pReader,*len_local,(long *)total);
              if (idpos < 0) {
                return idpos;
              }
              if (0 < idpos) {
                return -3;
              }
              if ((-1 < cluster_off) && (cluster_off < *len_local + *(long *)total)) {
                return -2;
              }
              if (status < *len_local + *(long *)total) {
                return -3;
              }
              unknown_size = ReadUInt(this->m_pReader,*len_local,(long *)total);
              if (unknown_size < 0) {
                return unknown_size;
              }
              *len_local = *(long *)total + *len_local;
              if (unknown_size != 0) break;
              this->m_pos = *len_local;
            }
            element_size = (1L << ((char)*(undefined8 *)total * '\a' & 0x3fU)) + -1;
            if (((-1 < cluster_off) && (unknown_size != element_size)) &&
               (cluster_off < unknown_size + *len_local)) {
              return -2;
            }
            if (size != 0x1c53bb6b) break;
            if (unknown_size == element_size) {
              return -2;
            }
            if (this->m_pCues == (Cues *)0x0) {
              local_88 = (*len_local - id) + unknown_size;
              this_00 = (Cues *)operator_new(0x48,(nothrow_t *)&std::nothrow);
              local_91 = 0;
              local_f8 = (Cues *)0x0;
              if (this_00 != (Cues *)0x0) {
                local_91 = 1;
                local_90 = this_00;
                Cues::Cues(this_00,this,*len_local,unknown_size,id,local_88);
                local_f8 = this_00;
              }
              this->m_pCues = local_f8;
              if (this->m_pCues == (Cues *)0x0) {
                return -1;
              }
            }
            this->m_pos = *len_local + unknown_size;
          }
          if (size == 0x1f43b675) {
            cluster_size = id - this->m_start;
            if (unknown_size != element_size) {
              result = unknown_size;
            }
            if (cluster_size < 0) {
              return -2;
            }
            segment_stop = Cluster::HasBlockEntries(this,cluster_size,&len_,&idx);
            if (segment_stop < 0) {
              *len_local = len_;
              *(long *)total = idx;
              return segment_stop;
            }
            idx_00 = this->m_clusterCount;
            if (0 < this->m_clusterPreloadCount) {
              if (this->m_clusterSize <= idx_00) {
                return -2;
              }
              pCVar4 = this->m_clusters[idx_00];
              if ((pCVar4 == (Cluster *)0x0) || (-1 < pCVar4->m_index)) {
                return -2;
              }
              lVar3 = Cluster::GetPosition(pCVar4);
              if (lVar3 < 0) {
                return -2;
              }
              if (lVar3 == cluster_size) {
                if (segment_stop == 0) {
                  return -2;
                }
                if (result < 0) {
                  lVar3 = Cluster::GetElementSize(pCVar4);
                  if (lVar3 < 1) {
                    return -2;
                  }
                  *len_local = pCVar4->m_element_start + lVar3;
                }
                else {
                  *len_local = result + *len_local;
                }
                pCVar4->m_index = idx_00;
                this->m_clusterCount = this->m_clusterCount + 1;
                this->m_clusterPreloadCount = this->m_clusterPreloadCount + -1;
                this->m_pos = *len_local;
                if ((-1 < cluster_off) && (cluster_off < this->m_pos)) {
                  return -2;
                }
                return 0;
              }
            }
            if (segment_stop == 0) {
              if (-1 < result) {
                *len_local = result + *len_local;
              }
              if ((-1 < avail) && (avail <= *len_local)) {
                this->m_pos = avail;
                return 1;
              }
              if ((-1 < cluster_off) && (cluster_off <= *len_local)) {
                this->m_pos = cluster_off;
                return 1;
              }
              this->m_pos = *len_local;
              return 2;
            }
            pCVar4 = Cluster::Create(this,idx_00,cluster_size);
            if (pCVar4 == (Cluster *)0x0) {
              return -1;
            }
            bVar1 = AppendCluster(this,pCVar4);
            if (!bVar1) {
              if (pCVar4 != (Cluster *)0x0) {
                Cluster::~Cluster(pCVar4);
                operator_delete(pCVar4);
              }
              return -1;
            }
            if (result < 0) {
              this->m_pUnknownSize = pCVar4;
              this->m_pos = -*len_local;
              return 0;
            }
            *len_local = result + *len_local;
            this->m_pos = *len_local;
            if ((0 < cluster_off) && (cluster_off < this->m_pos)) {
              return -2;
            }
            return 0;
          }
          if (unknown_size == element_size) break;
          this->m_pos = unknown_size + *len_local;
        }
        this_local = (Segment *)0xfffffffffffffffe;
      }
      else {
        this_local = (Segment *)0xfffffffffffffffe;
      }
    }
  }
  return (long)this_local;
}

Assistant:

long Segment::DoLoadCluster(long long& pos, long& len) {
  if (m_pos < 0)
    return DoLoadClusterUnknownSize(pos, len);

  long long total, avail;

  long status = m_pReader->Length(&total, &avail);

  if (status < 0)  // error
    return status;

  if (total >= 0 && avail > total)
    return E_FILE_FORMAT_INVALID;

  const long long segment_stop = (m_size < 0) ? -1 : m_start + m_size;

  long long cluster_off = -1;  // offset relative to start of segment
  long long cluster_size = -1;  // size of cluster payload

  for (;;) {
    if ((total >= 0) && (m_pos >= total))
      return 1;  // no more clusters

    if ((segment_stop >= 0) && (m_pos >= segment_stop))
      return 1;  // no more clusters

    pos = m_pos;

    // Read ID

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    long long result = GetUIntLength(m_pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)
      return E_BUFFER_NOT_FULL;

    if ((segment_stop >= 0) && ((pos + len) > segment_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long idpos = pos;
    const long long id = ReadID(m_pReader, idpos, len);

    if (id < 0)
      return E_FILE_FORMAT_INVALID;

    pos += len;  // consume ID

    // Read Size

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    result = GetUIntLength(m_pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)
      return E_BUFFER_NOT_FULL;

    if ((segment_stop >= 0) && ((pos + len) > segment_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long size = ReadUInt(m_pReader, pos, len);

    if (size < 0)  // error
      return static_cast<long>(size);

    pos += len;  // consume length of size of element

    // pos now points to start of payload

    if (size == 0) {
      // Missing element payload: move on.
      m_pos = pos;
      continue;
    }

    const long long unknown_size = (1LL << (7 * len)) - 1;

    if ((segment_stop >= 0) && (size != unknown_size) &&
        ((pos + size) > segment_stop)) {
      return E_FILE_FORMAT_INVALID;
    }

    if (id == libwebm::kMkvCues) {
      if (size == unknown_size) {
        // Cues element of unknown size: Not supported.
        return E_FILE_FORMAT_INVALID;
      }

      if (m_pCues == NULL) {
        const long long element_size = (pos - idpos) + size;

        m_pCues = new (std::nothrow) Cues(this, pos, size, idpos, element_size);
        if (m_pCues == NULL)
          return -1;
      }

      m_pos = pos + size;  // consume payload
      continue;
    }

    if (id != libwebm::kMkvCluster) {
      // Besides the Segment, Libwebm allows only cluster elements of unknown
      // size. Fail the parse upon encountering a non-cluster element reporting
      // unknown size.
      if (size == unknown_size)
        return E_FILE_FORMAT_INVALID;

      m_pos = pos + size;  // consume payload
      continue;
    }

    // We have a cluster.

    cluster_off = idpos - m_start;  // relative pos

    if (size != unknown_size)
      cluster_size = size;

    break;
  }

  if (cluster_off < 0) {
    // No cluster, die.
    return E_FILE_FORMAT_INVALID;
  }

  long long pos_;
  long len_;

  status = Cluster::HasBlockEntries(this, cluster_off, pos_, len_);

  if (status < 0) {  // error, or underflow
    pos = pos_;
    len = len_;

    return status;
  }

  // status == 0 means "no block entries found"
  // status > 0 means "found at least one block entry"

  // TODO:
  // The issue here is that the segment increments its own
  // pos ptr past the most recent cluster parsed, and then
  // starts from there to parse the next cluster.  If we
  // don't know the size of the current cluster, then we
  // must either parse its payload (as we do below), looking
  // for the cluster (or cues) ID to terminate the parse.
  // This isn't really what we want: rather, we really need
  // a way to create the curr cluster object immediately.
  // The pity is that cluster::parse can determine its own
  // boundary, and we largely duplicate that same logic here.
  //
  // Maybe we need to get rid of our look-ahead preloading
  // in source::parse???
  //
  // As we're parsing the blocks in the curr cluster
  //(in cluster::parse), we should have some way to signal
  // to the segment that we have determined the boundary,
  // so it can adjust its own segment::m_pos member.
  //
  // The problem is that we're asserting in asyncreadinit,
  // because we adjust the pos down to the curr seek pos,
  // and the resulting adjusted len is > 2GB.  I'm suspicious
  // that this is even correct, but even if it is, we can't
  // be loading that much data in the cache anyway.

  const long idx = m_clusterCount;

  if (m_clusterPreloadCount > 0) {
    if (idx >= m_clusterSize)
      return E_FILE_FORMAT_INVALID;

    Cluster* const pCluster = m_clusters[idx];
    if (pCluster == NULL || pCluster->m_index >= 0)
      return E_FILE_FORMAT_INVALID;

    const long long off = pCluster->GetPosition();
    if (off < 0)
      return E_FILE_FORMAT_INVALID;

    if (off == cluster_off) {  // preloaded already
      if (status == 0)  // no entries found
        return E_FILE_FORMAT_INVALID;

      if (cluster_size >= 0)
        pos += cluster_size;
      else {
        const long long element_size = pCluster->GetElementSize();

        if (element_size <= 0)
          return E_FILE_FORMAT_INVALID;  // TODO: handle this case

        pos = pCluster->m_element_start + element_size;
      }

      pCluster->m_index = idx;  // move from preloaded to loaded
      ++m_clusterCount;
      --m_clusterPreloadCount;

      m_pos = pos;  // consume payload
      if (segment_stop >= 0 && m_pos > segment_stop)
        return E_FILE_FORMAT_INVALID;

      return 0;  // success
    }
  }

  if (status == 0) {  // no entries found
    if (cluster_size >= 0)
      pos += cluster_size;

    if ((total >= 0) && (pos >= total)) {
      m_pos = total;
      return 1;  // no more clusters
    }

    if ((segment_stop >= 0) && (pos >= segment_stop)) {
      m_pos = segment_stop;
      return 1;  // no more clusters
    }

    m_pos = pos;
    return 2;  // try again
  }

  // status > 0 means we have an entry

  Cluster* const pCluster = Cluster::Create(this, idx, cluster_off);
  if (pCluster == NULL)
    return -1;

  if (!AppendCluster(pCluster)) {
    delete pCluster;
    return -1;
  }

  if (cluster_size >= 0) {
    pos += cluster_size;

    m_pos = pos;

    if (segment_stop > 0 && m_pos > segment_stop)
      return E_FILE_FORMAT_INVALID;

    return 0;
  }

  m_pUnknownSize = pCluster;
  m_pos = -pos;

  return 0;  // partial success, since we have a new cluster

  // status == 0 means "no block entries found"
  // pos designates start of payload
  // m_pos has NOT been adjusted yet (in case we need to come back here)
}